

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

void __thiscall Ident::SetTk(Ident *this,tokens token,ushort grfid)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (token == tkNone || 0x4d < (int)token) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0xc4,"(token != tkNone && token < tkID)","token != tkNone && token < tkID");
    if (!bVar2) goto LAB_00e7604e;
    *puVar3 = 0;
  }
  if (this->m_tk == tkLim) {
    this->m_tk = (ushort)token;
    this->m_grfid = this->m_grfid | grfid;
  }
  else {
    if (this->m_tk != token) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0xcc,"(m_tk == token)","m_tk == token");
      if (!bVar2) goto LAB_00e7604e;
      *puVar3 = 0;
    }
    if ((grfid & ~this->m_grfid) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0xcd,"((m_grfid & grfid) == grfid)","(m_grfid & grfid) == grfid");
      if (!bVar2) {
LAB_00e7604e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void Ident::SetTk(tokens token, ushort grfid)
{
    Assert(token != tkNone && token < tkID);
    if (m_tk == tkLim)
    {
        m_tk = (ushort)token;
        m_grfid |= grfid;
    }
    else
    {
        Assert(m_tk == token);
        Assert((m_grfid & grfid) == grfid);
    }
}